

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int64_t av1_delta_rate_cost(int64_t delta_rate,int64_t recrf_dist,int64_t srcrf_dist,int pix_num)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double den;
  double num;
  double log_den;
  double dr;
  int64_t rate_cost;
  double beta;
  undefined8 local_8;
  
  dVar1 = (double)in_RDX / (double)in_RSI;
  local_8 = in_RDI;
  if (0x80 < in_RDX) {
    dVar2 = (double)(in_RDI >> 0xd) / (double)in_ECX;
    dVar3 = log(dVar1);
    dVar4 = log(2.0);
    dVar2 = dVar2 + dVar2 + dVar3 / dVar4;
    dVar3 = log(10.0);
    dVar4 = log(2.0);
    if (dVar2 <= dVar3 / dVar4) {
      dVar2 = pow(2.0,dVar2);
      dVar1 = log(dVar2 / (dVar2 * dVar1 + (1.0 - dVar1) * dVar1));
      dVar2 = log(2.0);
      local_8 = (long)((((double)in_ECX * dVar1) / dVar2) / 2.0) << 0xd;
    }
    else {
      dVar1 = log(1.0 / dVar1);
      dVar2 = log(2.0);
      local_8 = (long)(((dVar1 * (double)in_ECX) / dVar2) / 2.0) << 0xd;
    }
  }
  return local_8;
}

Assistant:

int64_t av1_delta_rate_cost(int64_t delta_rate, int64_t recrf_dist,
                            int64_t srcrf_dist, int pix_num) {
  double beta = (double)srcrf_dist / recrf_dist;
  int64_t rate_cost = delta_rate;

  if (srcrf_dist <= 128) return rate_cost;

  double dr =
      (double)(delta_rate >> (TPL_DEP_COST_SCALE_LOG2 + AV1_PROB_COST_SHIFT)) /
      pix_num;

  double log_den = log(beta) / log(2.0) + 2.0 * dr;

  if (log_den > log(10.0) / log(2.0)) {
    rate_cost = (int64_t)((log(1.0 / beta) * pix_num) / log(2.0) / 2.0);
    rate_cost <<= (TPL_DEP_COST_SCALE_LOG2 + AV1_PROB_COST_SHIFT);
    return rate_cost;
  }

  double num = pow(2.0, log_den);
  double den = num * beta + (1 - beta) * beta;

  rate_cost = (int64_t)((pix_num * log(num / den)) / log(2.0) / 2.0);

  rate_cost <<= (TPL_DEP_COST_SCALE_LOG2 + AV1_PROB_COST_SHIFT);

  return rate_cost;
}